

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O0

_HashNode * __thiscall SQTable::_Get(SQTable *this,SQObjectPtr *key,SQHash hash)

{
  _HashNode *n;
  SQHash hash_local;
  SQObjectPtr *key_local;
  SQTable *this_local;
  
  n = this->_nodes + hash;
  while (((n->key).super_SQObject._unVal.pTable != (key->super_SQObject)._unVal.pTable ||
         ((n->key).super_SQObject._type != (key->super_SQObject)._type))) {
    n = n->next;
    if (n == (_HashNode *)0x0) {
      return (_HashNode *)0x0;
    }
  }
  return n;
}

Assistant:

inline _HashNode *_Get(const SQObjectPtr &key,SQHash hash)
    {
        _HashNode *n = &_nodes[hash];
        do{
            if(_rawval(n->key) == _rawval(key) && type(n->key) == type(key)){
                return n;
            }
        }while((n = n->next));
        return NULL;
    }